

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O2

void __thiscall
cbtGImpactMeshShapePart::TrimeshPrimitiveManager::get_primitive_box
          (TrimeshPrimitiveManager *this,int prim_index,cbtAABB *primbox)

{
  undefined4 in_register_00000034;
  cbtPrimitiveTriangle triangle;
  cbtVector3 cStack_58;
  cbtVector3 local_48;
  cbtVector3 local_38 [2];
  cbtScalar local_18;
  
  local_18 = 0.01;
  (*(this->super_cbtPrimitiveManagerBase)._vptr_cbtPrimitiveManagerBase[5])
            (this,CONCAT44(in_register_00000034,prim_index),&cStack_58);
  cbtAABB::calc_from_triangle_margin<cbtVector3>(primbox,&cStack_58,&local_48,local_38,local_18);
  return;
}

Assistant:

virtual void get_primitive_box(int prim_index, cbtAABB& primbox) const
		{
			cbtPrimitiveTriangle triangle;
			get_primitive_triangle(prim_index, triangle);
			primbox.calc_from_triangle_margin(
				triangle.m_vertices[0],
				triangle.m_vertices[1], triangle.m_vertices[2], triangle.m_margin);
		}